

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O1

err_t cvcParseOptions(btok_cvc_t *cvc,bool_t *eid,bool_t *esign,cmd_pwd_t *pwd,octet *date,
                     int *readc,int argc,char **argv)

{
  bool_t bVar1;
  int iVar2;
  err_t eVar3;
  size_t sVar4;
  bool_t *pbVar5;
  char *src;
  btok_cvc_t *dest;
  char **ppcVar6;
  octet *date_00;
  
  if (cvc != (btok_cvc_t *)0x0) {
    memSet(cvc,'\0',0x128);
  }
  if (eid != (bool_t *)0x0) {
    *eid = 0;
  }
  if (esign != (bool_t *)0x0) {
    *esign = 0;
  }
  if (pwd != (cmd_pwd_t *)0x0) {
    *pwd = (cmd_pwd_t)0x0;
  }
  if (date != (octet *)0x0) {
    memSet(date,'\0',6);
  }
  *readc = argc;
  if (argc == 0) {
    argc = 0;
    eVar3 = 0;
  }
  else {
    ppcVar6 = argv + 1;
    do {
      bVar1 = strStartsWith(ppcVar6[-1],"-");
      if (bVar1 == 0) goto LAB_0010a366;
      eVar3 = 0x25b;
      if (argc < 2) {
        argc = 1;
        goto LAB_0010a372;
      }
      iVar2 = strCmp(ppcVar6[-1],"-authority");
      if (iVar2 == 0) {
        if (cvc == (btok_cvc_t *)0x0) goto LAB_0010a372;
        sVar4 = strLen(cvc->authority);
        if (sVar4 != 0) goto LAB_0010a35b;
        sVar4 = strLen(*ppcVar6);
        if ((sVar4 == 0) || (sVar4 = strLen(*ppcVar6), sVar4 - 0xd < 0xfffffffffffffff2))
        goto LAB_0010a348;
        src = *ppcVar6;
        dest = cvc;
LAB_0010a208:
        strCopy(dest->authority,src);
      }
      else {
        iVar2 = strCmp(ppcVar6[-1],"-holder");
        if (iVar2 == 0) {
          if (cvc != (btok_cvc_t *)0x0) {
            sVar4 = strLen(cvc->holder);
            if (sVar4 != 0) goto LAB_0010a35b;
            sVar4 = strLen(*ppcVar6);
            if ((sVar4 != 0) && (sVar4 = strLen(*ppcVar6), 0xfffffffffffffff1 < sVar4 - 0xd)) {
              src = *ppcVar6;
              dest = (btok_cvc_t *)cvc->holder;
              goto LAB_0010a208;
            }
LAB_0010a348:
            argc = argc + -1;
            eVar3 = 0x135;
          }
          goto LAB_0010a372;
        }
        iVar2 = strCmp(ppcVar6[-1],"-from");
        if (iVar2 == 0) {
          date_00 = cvc->from;
          if (cvc == (btok_cvc_t *)0x0) goto LAB_0010a372;
LAB_0010a23c:
          bVar1 = memIsZero(date_00,6);
          if (bVar1 == 0) {
LAB_0010a35b:
            eVar3 = 0x25c;
            goto LAB_0010a372;
          }
          eVar3 = cmdDateParse(date_00,*ppcVar6);
        }
        else {
          iVar2 = strCmp(ppcVar6[-1],"-until");
          if (iVar2 == 0) {
            date_00 = cvc->until;
            if (cvc != (btok_cvc_t *)0x0) goto LAB_0010a23c;
            goto LAB_0010a372;
          }
          iVar2 = strCmp(ppcVar6[-1],"-eid");
          if (iVar2 == 0) {
            if (eid != (bool_t *)0x0 && cvc != (btok_cvc_t *)0x0) {
              if (*eid != 0) goto LAB_0010a35b;
              sVar4 = strLen(*ppcVar6);
              if ((sVar4 == 10) && (bVar1 = hexIsValid(*ppcVar6), bVar1 != 0)) {
                hexTo(cvc->hat_eid,*ppcVar6);
                pbVar5 = eid;
LAB_0010a304:
                *pbVar5 = 1;
                goto LAB_0010a30a;
              }
LAB_0010a3c5:
              argc = argc + -1;
              eVar3 = 0x137;
            }
            goto LAB_0010a372;
          }
          iVar2 = strCmp(ppcVar6[-1],"-esign");
          if (iVar2 == 0) {
            if (esign != (bool_t *)0x0 && cvc != (btok_cvc_t *)0x0) {
              if (*esign == 0) {
                sVar4 = strLen(*ppcVar6);
                if ((sVar4 == 4) && (bVar1 = hexIsValid(*ppcVar6), bVar1 != 0)) {
                  hexTo(cvc->hat_esign,*ppcVar6);
                  pbVar5 = esign;
                  goto LAB_0010a304;
                }
                goto LAB_0010a3c5;
              }
              goto LAB_0010a35b;
            }
            goto LAB_0010a372;
          }
          iVar2 = strCmp(ppcVar6[-1],"-pass");
          if (iVar2 != 0) {
            iVar2 = strCmp(ppcVar6[-1],"-date");
            if ((date != (octet *)0x0) && (date_00 = date, iVar2 == 0)) goto LAB_0010a23c;
            goto LAB_0010a372;
          }
          eVar3 = 0x25b;
          if (pwd == (cmd_pwd_t *)0x0) goto LAB_0010a372;
          if (*pwd != (cmd_pwd_t)0x0) {
            eVar3 = 0x25c;
            goto LAB_0010a372;
          }
          eVar3 = cmdPwdRead(pwd,*ppcVar6);
        }
        if (eVar3 != 0) {
          argc = argc + -1;
          goto LAB_0010a372;
        }
      }
LAB_0010a30a:
      ppcVar6 = ppcVar6 + 2;
      argc = argc + -2;
    } while (argc != 0);
    argc = 0;
LAB_0010a366:
    eVar3 = 0;
  }
LAB_0010a372:
  if (((pwd != (cmd_pwd_t *)0x0) && (eVar3 == 0)) && (eVar3 = 0x25b, *pwd != (cmd_pwd_t)0x0)) {
    eVar3 = 0;
  }
  if ((pwd == (cmd_pwd_t *)0x0) || (eVar3 == 0)) {
    *readc = *readc - argc;
  }
  else {
    cmdPwdClose(*pwd);
    *pwd = (cmd_pwd_t)0x0;
  }
  return eVar3;
}

Assistant:

static err_t cvcParseOptions(btok_cvc_t* cvc, bool_t* eid, bool_t* esign, 
	cmd_pwd_t* pwd, octet date[6], int* readc, int argc, char* argv[])
{
	err_t code = ERR_OK;
	// pre
	ASSERT(memIsNullOrValid(cvc, sizeof(btok_cvc_t)));
	ASSERT(memIsNullOrValid(eid, sizeof(bool_t)));
	ASSERT(memIsNullOrValid(esign, sizeof(bool_t)));
	ASSERT(memIsNullOrValid(pwd, sizeof(cmd_pwd_t)));
	ASSERT(memIsNullOrValid(date, 6));
	ASSERT(memIsValid(readc, sizeof(int)));
	// подготовить выходные данные
	cvc ? memSetZero(cvc, sizeof(btok_cvc_t)) : 0;
	eid ? *eid = 0 : 0;
	esign ? *esign = 0 : 0;
	pwd ? *pwd = 0 : 0;
	date ? memSetZero(date, 6) : 0;
	// обработать опции
	*readc = argc;
	while (argc && strStartsWith(*argv, "-"))
	{
		if (argc < 2)
		{
			code = ERR_CMD_PARAMS;
			break;
		}
		// authority
		if (strEq(argv[0], "-authority"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (strLen(cvc->authority))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (!strLen(*argv) || strLen(*argv) + 1 > sizeof(cvc->authority))
			{
				code = ERR_BAD_NAME;
				break;
			}
			strCopy(cvc->authority, *argv);
			--argc, ++argv;
		}
		// holder
		else if (strEq(argv[0], "-holder"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (strLen(cvc->holder))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (!strLen(*argv) || strLen(*argv) + 1 > sizeof(cvc->holder))
			{
				code = ERR_BAD_NAME;
				break;
			}
			strCopy(cvc->holder, *argv);
			--argc, ++argv;
		}
		// from
		else if (strEq(*argv, "-from"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (!memIsZero(cvc->from, 6))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			code = cmdDateParse(cvc->from, *argv);
			if (code != ERR_OK)
				break;
			--argc, ++argv;
		}
		// until
		else if (strEq(*argv, "-until"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (!memIsZero(cvc->until, 6))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			code = cmdDateParse(cvc->until, *argv);
			if (code != ERR_OK)
				break;
			--argc, ++argv;
		}
		// eid
		else if (strEq(*argv, "-eid"))
		{
			if (!cvc || !eid)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (*eid)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (strLen(*argv) != 10 || !hexIsValid(*argv))
			{
				code = ERR_BAD_ACL;
				break;
			}
			hexTo(cvc->hat_eid, *argv);
			*eid = TRUE;
			--argc, ++argv;
		}
		// esign
		else if (strEq(*argv, "-esign"))
		{
			if (!cvc || !esign)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (*esign)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (strLen(*argv) != 4 || !hexIsValid(*argv))
			{
				code = ERR_BAD_ACL;
				break;
			}
			hexTo(cvc->hat_esign, *argv);
			*esign = TRUE;
			--argc, ++argv;
		}
		// password
		else if (strEq(*argv, "-pass"))
		{
			if (!pwd)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (*pwd)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if ((code = cmdPwdRead(pwd, *argv)) != ERR_OK)
				break;
			--argc, ++argv;
		}
		// date
		else if (strEq(*argv, "-date"))
		{
			if (!date)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (!memIsZero(date, 6))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			code = cmdDateParse(date, *argv);
			if (code != ERR_OK)
				break;
			--argc, ++argv;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	// проверить, что запрошенные данные определены
	// \remark корректность cvc будет проверена позже
	// \remark параметр date не является обязательным
	if (code == ERR_OK && pwd && !*pwd)
		code = ERR_CMD_PARAMS;
	// завершить
	if (code != ERR_OK && pwd)
		cmdPwdClose(*pwd), *pwd = 0;
	else
		*readc -= argc;
	return code;
}